

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldOptions::Clear(FieldOptions *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  FieldOptions *this_local;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  if ((this->_has_bits_[0] & 0xff) != 0) {
    this->ctype_ = 0;
    this->packed_ = false;
    this->lazy_ = false;
    this->deprecated_ = false;
    bVar1 = has_experimental_map_key(this);
    if ((bVar1) && (this->experimental_map_key_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    this->weak_ = false;
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear(&this->uninterpreted_option_);
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void FieldOptions::Clear() {
  _extensions_.Clear();
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    ctype_ = 0;
    packed_ = false;
    lazy_ = false;
    deprecated_ = false;
    if (has_experimental_map_key()) {
      if (experimental_map_key_ != &::google::protobuf::internal::kEmptyString) {
        experimental_map_key_->clear();
      }
    }
    weak_ = false;
  }
  uninterpreted_option_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}